

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlRegexpPrint(FILE *output,xmlRegexpPtr regexp)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegRangePtr pxVar3;
  xmlRegStatePtr pxVar4;
  xmlRegTrans *pxVar5;
  xmlRegQuantType xVar6;
  xmlRegAtomType xVar7;
  xmlRegStateType xVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  size_t sStack_50;
  
  if (output != (FILE *)0x0) {
    fwrite(" regexp: ",9,1,(FILE *)output);
    if (regexp == (xmlRegexpPtr)0x0) {
      fwrite("NULL\n",5,1,(FILE *)output);
      return;
    }
    fprintf((FILE *)output,"\'%s\' ",regexp->string);
    fputc(10,(FILE *)output);
    fprintf((FILE *)output,"%d atoms:\n",(ulong)(uint)regexp->nbAtoms);
    for (uVar13 = 0; (long)uVar13 < (long)regexp->nbAtoms; uVar13 = uVar13 + 1) {
      fprintf((FILE *)output," %02d ",uVar13 & 0xffffffff);
      pxVar2 = regexp->atoms[uVar13];
      fwrite(" atom: ",7,1,(FILE *)output);
      if (pxVar2 == (xmlRegAtomPtr)0x0) {
        fwrite("NULL\n",5,1,(FILE *)output);
        goto LAB_00175292;
      }
      if (pxVar2->neg != 0) {
        fwrite("not ",4,1,(FILE *)output);
      }
      xmlRegPrintAtomType(output,pxVar2->type);
      xVar6 = pxVar2->quant;
      sStack_50 = 9;
      switch(xVar6) {
      case XML_REGEXP_QUANT_EPSILON:
        pcVar12 = "epsilon ";
        sStack_50 = 8;
        break;
      case XML_REGEXP_QUANT_ONCE:
        pcVar12 = "once ";
        sStack_50 = 5;
        break;
      case XML_REGEXP_QUANT_OPT:
        pcVar12 = "? ";
        goto LAB_0017512e;
      case XML_REGEXP_QUANT_MULT:
        pcVar12 = "* ";
        goto LAB_0017512e;
      case XML_REGEXP_QUANT_PLUS:
        pcVar12 = "+ ";
LAB_0017512e:
        sStack_50 = 2;
        break;
      case XML_REGEXP_QUANT_ONCEONLY:
        pcVar12 = "onceonly ";
        break;
      case XML_REGEXP_QUANT_ALL:
        pcVar12 = "all ";
        sStack_50 = 4;
        break;
      case XML_REGEXP_QUANT_RANGE:
        pcVar12 = "range ";
        sStack_50 = 6;
        break;
      default:
        goto switchD_001750ee_default;
      }
      fwrite(pcVar12,sStack_50,1,(FILE *)output);
      xVar6 = pxVar2->quant;
switchD_001750ee_default:
      if (xVar6 == XML_REGEXP_QUANT_RANGE) {
        fprintf((FILE *)output,"%d-%d ",(ulong)(uint)pxVar2->min,(ulong)(uint)pxVar2->max);
      }
      xVar7 = pxVar2->type;
      if (xVar7 == XML_REGEXP_STRING) {
        fprintf((FILE *)output,"\'%s\' ",pxVar2->valuep);
        xVar7 = pxVar2->type;
      }
      if (xVar7 == XML_REGEXP_SUBREG) {
        fprintf((FILE *)output,"start %d end %d\n",(ulong)(uint)pxVar2->start->no,
                (ulong)(uint)pxVar2->stop->no);
      }
      else if (xVar7 == XML_REGEXP_RANGES) {
        fprintf((FILE *)output,"%d entries\n",(ulong)(uint)pxVar2->nbRanges);
        for (lVar10 = 0; lVar10 < pxVar2->nbRanges; lVar10 = lVar10 + 1) {
          pxVar3 = pxVar2->ranges[lVar10];
          fwrite("  range: ",9,1,(FILE *)output);
          if (pxVar3->neg != 0) {
            fwrite("negative ",9,1,(FILE *)output);
          }
          xmlRegPrintAtomType(output,pxVar3->type);
          fprintf((FILE *)output,"%c - %c\n",(ulong)(uint)pxVar3->start,(ulong)(uint)pxVar3->end);
        }
      }
      else if (xVar7 == XML_REGEXP_CHARVAL) {
        fprintf((FILE *)output,"char %c\n",(ulong)(uint)pxVar2->codepoint);
      }
      else {
        fputc(10,(FILE *)output);
      }
LAB_00175292:
    }
    fprintf((FILE *)output,"%d states:",(ulong)(uint)regexp->nbStates);
    fputc(10,(FILE *)output);
    for (lVar10 = 0; lVar10 < regexp->nbStates; lVar10 = lVar10 + 1) {
      pxVar4 = regexp->states[lVar10];
      fwrite(" state: ",8,1,(FILE *)output);
      if (pxVar4 == (xmlRegStatePtr)0x0) {
        fwrite("NULL\n",5,1,(FILE *)output);
      }
      else {
        xVar8 = pxVar4->type;
        if (xVar8 == XML_REGEXP_START_STATE) {
          fwrite("START ",6,1,(FILE *)output);
          xVar8 = pxVar4->type;
        }
        if (xVar8 == XML_REGEXP_FINAL_STATE) {
          fwrite("FINAL ",6,1,(FILE *)output);
        }
        fprintf((FILE *)output,"%d, %d transitions:\n",(ulong)(uint)pxVar4->no,
                (ulong)(uint)pxVar4->nbTrans);
        lVar11 = 0;
        for (lVar14 = 0; lVar14 < pxVar4->nbTrans; lVar14 = lVar14 + 1) {
          pxVar5 = pxVar4->trans;
          fwrite("  trans: ",9,1,(FILE *)output);
          if (pxVar5 == (xmlRegTrans *)0x0) {
            pcVar12 = "NULL\n";
            sStack_50 = 5;
LAB_001753ba:
            fwrite(pcVar12,sStack_50,1,(FILE *)output);
          }
          else {
            if (*(int *)((long)&pxVar5->to + lVar11) < 0) {
              pcVar12 = "removed\n";
              sStack_50 = 8;
              goto LAB_001753ba;
            }
            iVar1 = *(int *)((long)&pxVar5->nd + lVar11);
            if (iVar1 != 0) {
              if (iVar1 == 2) {
                pcVar12 = "last not determinist, ";
                sStack_50 = 0x16;
              }
              else {
                pcVar12 = "not determinist, ";
                sStack_50 = 0x11;
              }
              fwrite(pcVar12,sStack_50,1,(FILE *)output);
            }
            if (-1 < *(int *)((long)&pxVar5->counter + lVar11)) {
              fprintf((FILE *)output,"counted %d, ");
            }
            iVar1 = *(int *)((long)&pxVar5->count + lVar11);
            if (iVar1 == 0x123456) {
              fwrite("all transition, ",0x10,1,(FILE *)output);
            }
            else if (-1 < iVar1) {
              fprintf((FILE *)output,"count based %d, ");
            }
            puVar9 = *(uint **)((long)&pxVar5->atom + lVar11);
            if (puVar9 == (uint *)0x0) {
              fprintf((FILE *)output,"epsilon to %d\n",(ulong)*(uint *)((long)&pxVar5->to + lVar11))
              ;
            }
            else {
              if (puVar9[1] == 2) {
                fprintf((FILE *)output,"char %c ",(ulong)puVar9[0xb]);
                puVar9 = *(uint **)((long)&pxVar5->atom + lVar11);
              }
              fprintf((FILE *)output,"atom %d, to %d\n",(ulong)*puVar9,
                      (ulong)*(uint *)((long)&pxVar5->to + lVar11));
            }
          }
          lVar11 = lVar11 + 0x18;
        }
      }
    }
    fprintf((FILE *)output,"%d counters:\n",(ulong)(uint)regexp->nbCounters);
    for (uVar13 = 0; (long)uVar13 < (long)regexp->nbCounters; uVar13 = uVar13 + 1) {
      fprintf((FILE *)output," %d: min %d max %d\n",uVar13 & 0xffffffff,
              (ulong)(uint)regexp->counters[uVar13].min,(ulong)(uint)regexp->counters[uVar13].max);
    }
  }
  return;
}

Assistant:

void
xmlRegexpPrint(FILE *output, xmlRegexpPtr regexp) {
    int i;

    if (output == NULL)
        return;
    fprintf(output, " regexp: ");
    if (regexp == NULL) {
	fprintf(output, "NULL\n");
	return;
    }
    fprintf(output, "'%s' ", regexp->string);
    fprintf(output, "\n");
    fprintf(output, "%d atoms:\n", regexp->nbAtoms);
    for (i = 0;i < regexp->nbAtoms; i++) {
	fprintf(output, " %02d ", i);
	xmlRegPrintAtom(output, regexp->atoms[i]);
    }
    fprintf(output, "%d states:", regexp->nbStates);
    fprintf(output, "\n");
    for (i = 0;i < regexp->nbStates; i++) {
	xmlRegPrintState(output, regexp->states[i]);
    }
    fprintf(output, "%d counters:\n", regexp->nbCounters);
    for (i = 0;i < regexp->nbCounters; i++) {
	fprintf(output, " %d: min %d max %d\n", i, regexp->counters[i].min,
		                                regexp->counters[i].max);
    }
}